

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O0

_Bool pthread_create_fptr_init(void)

{
  if ((pthread_create_fptr ==
       (_func_int_pthread_t_ptr_pthread_attr_t_ptr__func_void_ptr_void_ptr_ptr_void_ptr *)0x0) &&
     (pthread_create_fptr =
           (_func_int_pthread_t_ptr_pthread_attr_t_ptr__func_void_ptr_void_ptr_ptr_void_ptr *)
           dlsym(0xffffffffffffffff,"pthread_create"),
     pthread_create_fptr ==
     (_func_int_pthread_t_ptr_pthread_attr_t_ptr__func_void_ptr_void_ptr_ptr_void_ptr *)0x0)) {
    pthread_create_fptr = pthread_create;
  }
  return false;
}

Assistant:

static bool
pthread_create_fptr_init(void) {
	if (pthread_create_fptr != NULL) {
		return false;
	}
	/*
	 * Try the next symbol first, because 1) when use lazy_lock we have a
	 * wrapper for pthread_create; and 2) application may define its own
	 * wrapper as well (and can call malloc within the wrapper).
	 */
#ifdef JEMALLOC_HAVE_DLSYM
	pthread_create_fptr = dlsym(RTLD_NEXT, "pthread_create");
#else
	pthread_create_fptr = NULL;
#endif
	if (pthread_create_fptr == NULL) {
		if (config_lazy_lock) {
			malloc_write("<jemalloc>: Error in dlsym(RTLD_NEXT, "
			    "\"pthread_create\")\n");
			abort();
		} else {
			/* Fall back to the default symbol. */
			pthread_create_fptr = pthread_create;
		}
	}

	return false;
}